

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Utest.cpp
# Opt level: O2

void __thiscall
UtestShell::assertBinaryEqual
          (UtestShell *this,void *expected,void *actual,size_t length,char *text,char *fileName,
          int lineNumber,TestTerminator *testTerminator)

{
  int iVar1;
  TestResult *pTVar2;
  SimpleString *pSVar3;
  SimpleString *pSVar4;
  SimpleString SStack_78;
  TestFailure local_70;
  
  pSVar3 = &SStack_78;
  pSVar4 = &SStack_78;
  pTVar2 = getTestResult(this);
  (*pTVar2->_vptr_TestResult[10])(pTVar2);
  if (expected != (void *)0x0 || actual != (void *)0x0) {
    if (expected == (void *)0x0 || actual == (void *)0x0) {
      SimpleString::SimpleString(&SStack_78,text);
      BinaryEqualFailure::BinaryEqualFailure
                ((BinaryEqualFailure *)&local_70,this,fileName,lineNumber,(uchar *)expected,
                 (uchar *)actual,length,&SStack_78);
      (*this->_vptr_UtestShell[0x25])(this,&local_70,testTerminator,pSVar3);
      TestFailure::~TestFailure(&local_70);
      SimpleString::~SimpleString(&SStack_78);
    }
    iVar1 = SimpleString::MemCmp(expected,actual,length);
    if (iVar1 != 0) {
      SimpleString::SimpleString(&SStack_78,text);
      BinaryEqualFailure::BinaryEqualFailure
                ((BinaryEqualFailure *)&local_70,this,fileName,lineNumber,(uchar *)expected,
                 (uchar *)actual,length,&SStack_78);
      (*this->_vptr_UtestShell[0x25])(this,&local_70,testTerminator,pSVar4);
      TestFailure::~TestFailure(&local_70);
      SimpleString::~SimpleString(&SStack_78);
    }
  }
  return;
}

Assistant:

void UtestShell::assertBinaryEqual(const void *expected, const void *actual, size_t length, const char* text, const char *fileName, int lineNumber, const TestTerminator& testTerminator)
{
    getTestResult()->countCheck();
    if (actual == 0 && expected == 0) return;
    if (actual == 0 || expected == 0)
        failWith(BinaryEqualFailure(this, fileName, lineNumber, (const unsigned char *) expected, (const unsigned char *) actual, length, text), testTerminator);
    if (SimpleString::MemCmp(expected, actual, length) != 0)
        failWith(BinaryEqualFailure(this, fileName, lineNumber, (const unsigned char *) expected, (const unsigned char *) actual, length, text), testTerminator);
}